

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# executionengine.cpp
# Opt level: O0

void __thiscall ExecutionEngine::i_fcmpg(ExecutionEngine *this)

{
  uint uVar1;
  VMStack *this_00;
  Frame *this_01;
  Value VVar2;
  Value VVar3;
  Value resultado;
  Value value_1;
  Value value_2;
  Frame *topFrame;
  VMStack *stackFrame;
  ExecutionEngine *this_local;
  
  this_00 = VMStack::getInstance();
  this_01 = VMStack::getTopFrame(this_00);
  VVar2 = Frame::popTopOfOperandStack(this_01);
  VVar3 = Frame::popTopOfOperandStack(this_01);
  value_1.data.longValue._4_4_ = VVar2.type;
  if (value_1.data.longValue._4_4_ != 5) {
    __assert_fail("value_2.type == ValueType::FLOAT",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/gabepk[P]jvm/src/executionengine.cpp"
                  ,0xb86,"void ExecutionEngine::i_fcmpg()");
  }
  resultado.data.longValue._4_4_ = VVar3.type;
  if (resultado.data.longValue._4_4_ != 5) {
    __assert_fail("value_1.type == ValueType::FLOAT",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/gabepk[P]jvm/src/executionengine.cpp"
                  ,0xb87,"void ExecutionEngine::i_fcmpg()");
  }
  value_1.printType = VVar3.data._0_4_;
  uVar1 = std::isnan((double)(ulong)value_1.printType);
  if ((uVar1 & 1) == 0) {
    value_2.printType = VVar2.data._0_4_;
    uVar1 = std::isnan((double)(ulong)value_2.printType);
    if ((uVar1 & 1) == 0) {
      if ((float)value_1.printType <= (float)value_2.printType) {
        if (((float)value_1.printType != (float)value_2.printType) ||
           (NAN((float)value_1.printType) || NAN((float)value_2.printType))) {
          resultado.printType = ~BOOLEAN;
        }
        else {
          resultado.printType = BOOLEAN;
        }
      }
      else {
        resultado.printType = BYTE;
      }
      goto LAB_0013d9cc;
    }
  }
  resultado.printType = BYTE;
LAB_0013d9cc:
  VVar2.data.longValue._4_4_ = resultado.type;
  VVar2.data.returnAddress = resultado.printType;
  VVar2.printType = INT;
  VVar2.type = INT;
  Frame::pushIntoOperandStack(this_01,VVar2);
  this_01->pc = this_01->pc + 1;
  return;
}

Assistant:

void ExecutionEngine::i_fcmpg() {
	VMStack &stackFrame = VMStack::getInstance();
	Frame *topFrame = stackFrame.getTopFrame();

	Value value_2 = topFrame->popTopOfOperandStack();
	Value value_1 = topFrame->popTopOfOperandStack();
	Value resultado;
    resultado.printType = ValueType::INT;
	resultado.type = ValueType::INT;

	assert(value_2.type == ValueType::FLOAT);
	assert(value_1.type == ValueType::FLOAT);

	if (isnan(value_1.data.floatValue) || isnan(value_2.data.floatValue)) {
		resultado.data.intValue = 1;
	} else if (value_1.data.floatValue > value_2.data.floatValue) {
		resultado.data.intValue = 1;
	} else if (value_1.data.floatValue == value_2.data.floatValue) {
		resultado.data.intValue = 0;
	} else {
		resultado.data.intValue = -1;
	}

	topFrame->pushIntoOperandStack(resultado);

	topFrame->pc += 1;
}